

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O2

void flip_cursor(void)

{
  DLword *pDVar1;
  long lVar2;
  ushort *puVar3;
  
  pDVar1 = EmCursorBitMap68K;
  if (for_makeinit == 0) {
    for (lVar2 = 0; (int)lVar2 != 0x20; lVar2 = lVar2 + 2) {
      puVar3 = (ushort *)((long)pDVar1 + lVar2 ^ 2);
      *puVar3 = ~*puVar3;
    }
  }
  Set_XCursor(Current_Hot_X,0xf - Current_Hot_Y);
  return;
}

Assistant:

void flip_cursor(void) {
  DLword *word;
  int cnt;
  extern int ScreenLocked;
  extern DLword *EmCursorX68K, *EmCursorY68K;

  word = EmCursorBitMap68K;

#ifdef INIT

  /* since this is called frequently, and you don't want to have
     to build a different LDE to run the 2 parts of a Loadup, there is
     an ifdef AND a test.  This way we don't generate
     extra code for anybody else building an LDE
     except those who want to try building loadups.  */

  if (!for_makeinit) {
    for (cnt = CURSORHEIGHT; (cnt--);) { GETWORD(word++) ^= 0xFFFF; }
  }

#else

  for (cnt = CURSORHEIGHT; (cnt--);) { GETWORD(word++) ^= 0xFFFF; }

#endif


#if defined(XWINDOW)
  /* JDS 011213: 15- cur y, as function does same! */
  Set_XCursor(Current_Hot_X, 15 - Current_Hot_Y);
#elif defined(SDL)
  sdl_setCursor(0, 0); // TODO: keep track of the current hot_x and hot_y
#endif /* XWINDOW */
}